

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O3

void __thiscall wallet::CWallet::SetupDescriptorScriptPubKeyMans(CWallet *this,CExtKey *master_key)

{
  WalletDatabase *pWVar1;
  bool bVar2;
  long lVar3;
  runtime_error *this_00;
  long lVar4;
  long in_FS_OFFSET;
  OutputType t;
  OutputType local_54;
  WalletBatch local_50;
  undefined2 local_3a;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pWVar1 = (this->m_database)._M_t.
           super___uniq_ptr_impl<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
           ._M_t.
           super__Tuple_impl<0UL,_wallet::WalletDatabase_*,_std::default_delete<wallet::WalletDatabase>_>
           .super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl;
  if (pWVar1 == (WalletDatabase *)0x0) {
    __assert_fail("static_cast<bool>(m_database)",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.h"
                  ,0x1be,"virtual WalletDatabase &wallet::CWallet::GetDatabase() const");
  }
  (*pWVar1->_vptr_WalletDatabase[0xe])(&local_50,pWVar1,1);
  local_50.m_database = pWVar1;
  bVar2 = WalletBatch::TxnBegin(&local_50);
  if (bVar2) {
    local_3a = 0x100;
    lVar3 = 0;
    do {
      bVar2 = *(bool *)((long)&local_3a + lVar3);
      lVar4 = 0;
      do {
        local_54 = *(OutputType *)((long)OUTPUT_TYPES._M_elems + lVar4);
        SetupDescriptorScriptPubKeyMan(this,&local_50,master_key,&local_54,bVar2);
        lVar4 = lVar4 + 4;
      } while (lVar4 != 0x10);
      lVar3 = lVar3 + 1;
    } while (lVar3 != 2);
    bVar2 = WalletBatch::TxnCommit(&local_50);
    if (bVar2) {
      if ((__uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>)
          local_50.m_batch._M_t.
          super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>.
          _M_t.
          super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
          .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl !=
          (__uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>)0x0)
      {
        (*(*(_func_int ***)
            local_50.m_batch._M_t.
            super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>
            ._M_t.
            super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
            .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl)[5])();
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return;
      }
      goto LAB_005389ef;
    }
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_00,"Error: cannot commit db transaction for descriptors setup");
  }
  else {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_00,"Error: cannot create db transaction for descriptors setup");
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
LAB_005389ef:
  __stack_chk_fail();
}

Assistant:

void CWallet::SetupDescriptorScriptPubKeyMans(const CExtKey& master_key)
{
    AssertLockHeld(cs_wallet);

    // Create single batch txn
    WalletBatch batch(GetDatabase());
    if (!batch.TxnBegin()) throw std::runtime_error("Error: cannot create db transaction for descriptors setup");

    for (bool internal : {false, true}) {
        for (OutputType t : OUTPUT_TYPES) {
            SetupDescriptorScriptPubKeyMan(batch, master_key, t, internal);
        }
    }

    // Ensure information is committed to disk
    if (!batch.TxnCommit()) throw std::runtime_error("Error: cannot commit db transaction for descriptors setup");
}